

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-strtod.cpp
# Opt level: O3

bool __thiscall
icu_63::double_conversion::ComputeGuess
          (double_conversion *this,Vector<const_char> trimmed,int exponent,double *guess)

{
  double_conversion *pdVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  undefined4 in_register_0000000c;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  DiyFp diy_fp;
  int cached_decimal_exponent;
  DiyFp cached_power;
  DiyFp local_60;
  int local_4c;
  DiyFp local_48;
  DiyFp local_38;
  
  pdVar6 = (double *)CONCAT44(in_register_0000000c,exponent);
  uVar10 = (uint)trimmed.start_;
  if (uVar10 == 0) goto LAB_002764e0;
  uVar3 = trimmed.length_;
  iVar13 = uVar3 + uVar10;
  if (0x135 < iVar13) {
    *pdVar6 = INFINITY;
    return true;
  }
  if (iVar13 < -0x143) goto LAB_002764e0;
  if ((int)uVar10 < 0x10) {
    if (0xffffffe9 < uVar3) {
      if ((int)uVar10 < 1) {
        dVar16 = 0.0;
      }
      else {
        uVar7 = 1;
        uVar11 = 0;
        do {
          uVar11 = ((long)(char)this[uVar7 - 1] + uVar11 * 10) - 0x30;
          if (uVar10 <= uVar7) break;
          uVar7 = uVar7 + 1;
        } while (uVar11 < 0x1999999999999999);
        auVar17._8_4_ = (int)(uVar11 >> 0x20);
        auVar17._0_8_ = uVar11;
        auVar17._12_4_ = 0x45300000;
        dVar16 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
      }
      dVar16 = dVar16 / *(double *)(exact_powers_of_ten + (ulong)-uVar3 * 8);
LAB_002766df:
      *pdVar6 = dVar16;
      return true;
    }
    if (uVar3 < 0x17) {
      if ((int)uVar10 < 1) {
        dVar16 = 0.0;
      }
      else {
        uVar7 = 1;
        uVar11 = 0;
        do {
          uVar11 = ((long)(char)this[uVar7 - 1] + uVar11 * 10) - 0x30;
          if (uVar10 <= uVar7) break;
          uVar7 = uVar7 + 1;
        } while (uVar11 < 0x1999999999999999);
        auVar18._8_4_ = (int)(uVar11 >> 0x20);
        auVar18._0_8_ = uVar11;
        auVar18._12_4_ = 0x45300000;
        dVar16 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
      }
      dVar16 = dVar16 * *(double *)(exact_powers_of_ten + (ulong)uVar3 * 8);
      goto LAB_002766df;
    }
    if (-1 < (int)uVar3) {
      iVar5 = uVar3 - (0xf - uVar10);
      if (iVar5 < 0x17) {
        if ((int)uVar10 < 1) {
          dVar16 = 0.0;
        }
        else {
          uVar7 = 1;
          uVar11 = 0;
          do {
            uVar11 = ((long)(char)this[uVar7 - 1] + uVar11 * 10) - 0x30;
            if (uVar10 <= uVar7) break;
            uVar7 = uVar7 + 1;
          } while (uVar11 < 0x1999999999999999);
          auVar19._8_4_ = (int)(uVar11 >> 0x20);
          auVar19._0_8_ = uVar11;
          auVar19._12_4_ = 0x45300000;
          dVar16 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
        }
        dVar16 = dVar16 * *(double *)(exact_powers_of_ten + (long)(int)(0xf - uVar10) * 8) *
                 *(double *)(exact_powers_of_ten + (long)iVar5 * 8);
        goto LAB_002766df;
      }
    }
    if (0 < (int)uVar10) goto LAB_00276436;
    uVar7 = 0;
    local_60.f_ = 0;
  }
  else {
LAB_00276436:
    uVar7 = 0;
    local_60.f_ = 0;
    do {
      pdVar1 = this + uVar7;
      uVar7 = uVar7 + 1;
      local_60.f_ = ((long)(char)*pdVar1 + local_60.f_ * 10) - 0x30;
      if (uVar10 <= uVar7) break;
    } while (local_60.f_ < 0x1999999999999999);
  }
  local_60.e_ = 0;
  uVar9 = (uint)uVar7;
  if (uVar9 == uVar10) {
    lVar12 = 0;
  }
  else {
    local_60.f_ = local_60.f_ + ('4' < (char)this[(int)uVar9]);
    uVar3 = iVar13 - uVar9;
    lVar12 = 4;
  }
  if (local_60.f_ >> 0x36 == 0) {
    local_60.e_ = 0;
    uVar7 = local_60.f_;
    do {
      local_60.f_ = uVar7 << 10;
      local_60.e_ = local_60.e_ - 10;
      bVar15 = uVar7 < 0x100000000000;
      uVar7 = local_60.f_;
    } while (bVar15);
  }
  for (; -1 < (long)local_60.f_; local_60.f_ = local_60.f_ * 2) {
    local_60.e_ = local_60.e_ - 1;
  }
  lVar12 = lVar12 << (-(char)local_60.e_ & 0x3fU);
  if (-0x15d < (int)uVar3) {
    local_48.f_ = 0;
    local_48.e_ = 0;
    PowersOfTenCache::GetCachedPowerForDecimalExponent(uVar3,&local_48,&local_4c);
    iVar13 = uVar3 - local_4c;
    if (iVar13 != 0) {
      uVar3 = iVar13 - 1;
      if (6 < uVar3) {
        abort();
      }
      local_38.e_ = *(int *)(&DAT_002f8838 + (ulong)uVar3 * 4);
      local_38.f_ = *(uint64_t *)(&DAT_002f8858 + (ulong)uVar3 * 8);
      DiyFp::Multiply(&local_60,&local_38);
      if ((int)(0x13 - uVar10) < iVar13) {
        lVar12 = lVar12 + 4;
      }
    }
    DiyFp::Multiply(&local_60,&local_48);
    uVar7 = local_60.f_;
    uVar10 = local_60.e_;
    if (local_60.f_ < 0x40000000000000) {
      do {
        uVar7 = local_60.f_ << 10;
        uVar10 = uVar10 - 10;
        bVar15 = local_60.f_ < 0x100000000000;
        local_60.f_ = uVar7;
      } while (bVar15);
    }
    for (; -1 < (long)uVar7; uVar7 = uVar7 * 2) {
      uVar10 = uVar10 - 1;
    }
    uVar11 = (9 - (ulong)(lVar12 == 0)) + lVar12 << ((char)local_60.e_ - (char)uVar10 & 0x3fU);
    uVar3 = 0;
    if (0xfffffbce < uVar10 + 0x40) {
      uVar3 = uVar10 + 0x472;
    }
    uVar8 = 0x35;
    if ((int)uVar10 < -0x43d) {
      uVar8 = (ulong)uVar3;
    }
    iVar13 = (int)uVar8;
    if (iVar13 < 4) {
      bVar4 = (byte)(4 - iVar13);
      uVar7 = uVar7 >> (bVar4 & 0x3f);
      uVar10 = (4 - iVar13) + uVar10;
      uVar8 = (ulong)uVar10;
      uVar11 = (uVar11 >> (bVar4 & 0x3f)) + 9;
      iVar13 = 0x3c;
    }
    else {
      iVar13 = 0x40 - iVar13;
    }
    bVar4 = (byte)iVar13;
    uVar14 = (~(-1L << (bVar4 & 0x3f)) & uVar7) << 3;
    lVar12 = 8L << (bVar4 - 1 & 0x3f);
    diy_fp.f_ = (ulong)(uVar10 + iVar13);
    uVar2 = uVar11 + lVar12;
    diy_fp._8_8_ = uVar8;
    local_60.f_ = uVar7;
    local_60.e_ = uVar10;
    dVar16 = (double)Double::DiyFpToUint64
                               ((Double *)
                                (((uVar7 >> (bVar4 & 0x3f)) + 1) - (ulong)(uVar14 < uVar2)),diy_fp);
    *pdVar6 = dVar16;
    if (lVar12 - uVar11 < uVar14) {
      if (uVar14 < uVar2) {
        return INFINITY <= dVar16;
      }
      return true;
    }
    return true;
  }
LAB_002764e0:
  *pdVar6 = 0.0;
  return true;
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}